

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

void * Eigen::internal::aligned_realloc(void *ptr,size_t new_size,size_t old_size)

{
  void *pvVar1;
  
  pvVar1 = realloc(ptr,new_size);
  if (new_size != 0 && pvVar1 == (void *)0x0) {
    throw_std_bad_alloc();
  }
  return pvVar1;
}

Assistant:

inline void* aligned_realloc(void *ptr, std::size_t new_size, std::size_t old_size)
{
  EIGEN_UNUSED_VARIABLE(old_size);

  void *result;
#if (EIGEN_DEFAULT_ALIGN_BYTES==0) || EIGEN_MALLOC_ALREADY_ALIGNED
  result = std::realloc(ptr,new_size);
#else
  result = handmade_aligned_realloc(ptr,new_size,old_size);
#endif

  if (!result && new_size)
    throw_std_bad_alloc();

  return result;
}